

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void SL::WS_LITE::
     handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
                *socket,unsigned_short code,string *msg)

{
  element_type *peVar1;
  ostream *this;
  error_category *peVar2;
  element_type *peVar3;
  error_code ec;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ec);
  this = std::operator<<((ostream *)&ec,"Closed: ");
  std::ostream::operator<<(this,code);
  Log(INFO_log_level,
      "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
      ,0xdd,"handleclose",(ostringstream *)&ec);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ec);
  peVar3 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar3->SocketStatus_ = CLOSED;
  peVar3->Writing = NOTWRITING;
  peVar1 = (peVar3->Parent).
           super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->onDisconnection).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__shared_ptr<SL::WS_LITE::IWebSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>,void>
              ((__shared_ptr<SL::WS_LITE::IWebSocket,(__gnu_cxx::_Lock_policy)2> *)&ec,
               &socket->
                super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              );
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&peVar1->onDisconnection,(shared_ptr<SL::WS_LITE::IWebSocket> *)&ec,code,msg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec._M_cat);
    peVar3 = (socket->
             super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  }
  std::deque<SL::WS_LITE::SendQueueItem,_std::allocator<SL::WS_LITE::SendQueueItem>_>::clear
            (&peVar3->SendMessageQueue);
  WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::canceltimers
            ((socket->
             super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  ec._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  ec._M_cat = peVar2;
  asio::basic_socket<asio::ip::tcp>::shutdown
            ((basic_socket<asio::ip::tcp> *)
             &((socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->Socket,2,(int)&ec);
  ec._M_value = 0;
  ec._M_cat = peVar2;
  asio::basic_socket<asio::ip::tcp>::close
            ((basic_socket<asio::ip::tcp> *)
             &((socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->Socket,(int)&ec);
  return;
}

Assistant:

inline void handleclose(const SOCKETTYPE &socket, unsigned short code, const std::string &msg)
    {
        SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Closed: " << code);
        socket->SocketStatus_ = SocketStatus::CLOSED;
        socket->Writing = SocketIOStatus::NOTWRITING;
        if (socket->Parent->onDisconnection) {
            socket->Parent->onDisconnection(socket, code, msg);
        }

        socket->SendMessageQueue.clear(); // clear all outbound messages
        socket->canceltimers();
        std::error_code ec;
        socket->Socket.lowest_layer().shutdown(asio::ip::tcp::socket::shutdown_both, ec);
        ec.clear();
        socket->Socket.lowest_layer().close(ec);
    }